

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O1

ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> *
llvm::MemoryBuffer::getFileAsStream
          (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
           *__return_storage_ptr__,Twine *Filename)

{
  error_code eVar1;
  int FD;
  int local_34;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>_2
  local_30;
  byte local_20;
  
  eVar1 = sys::fs::openFileForRead(Filename,&local_34,F_None,(SmallVectorImpl<char> *)0x0);
  if (eVar1._M_value == 0) {
    getMemoryBufferForStream
              ((ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
                *)&local_30.TStorage,local_34,Filename);
    ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
    moveConstruct<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
              ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                *)__return_storage_ptr__,
               (ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
                *)&local_30.TStorage);
    if ((local_20 & 1) == 0) {
      if (local_30.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer !=
          (AlignedCharArray<8UL,_8UL>)0x0) {
        (**(code **)(*(long *)local_30.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer + 8))();
      }
      local_30.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer =
           (AlignedCharArrayUnion<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
            )(AlignedCharArray<8UL,_8UL>)0x0;
    }
    close(local_34);
  }
  else {
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
    *(int *)&__return_storage_ptr__->field_0 = eVar1._M_value;
    *(error_category **)((long)&__return_storage_ptr__->field_0 + 8) = eVar1._M_cat;
  }
  return __return_storage_ptr__;
}

Assistant:

ErrorOr<std::unique_ptr<MemoryBuffer>>
MemoryBuffer::getFileAsStream(const Twine &Filename) {
  int FD;
  std::error_code EC = sys::fs::openFileForRead(Filename, FD, sys::fs::OF_None);
  if (EC)
    return EC;
  ErrorOr<std::unique_ptr<MemoryBuffer>> Ret =
      getMemoryBufferForStream(FD, Filename);
  close(FD);
  return Ret;
}